

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void a0idalloc(void *ptr,_Bool is_internal)

{
  long *plVar1;
  void *pvVar2;
  uintptr_t key;
  undefined7 in_register_00000031;
  uintptr_t in_R8;
  rtree_metadata_t rVar3;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1b0;
  
  if ((int)CONCAT71(in_register_00000031,is_internal) != 0) {
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)&stack0xfffffffffffffe68);
    rtree_read(&local_1b0,(tsdn_t *)0x0,(rtree_t *)&stack0xfffffffffffffe68,(rtree_ctx_t *)ptr,in_R8
              );
    key = (uintptr_t)((uint)(local_1b0.edata)->e_bits & 0xfff);
    pvVar2 = duckdb_je_arenas[key].repr;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)&stack0xfffffffffffffe68);
    rVar3 = rtree_metadata_read((tsdn_t *)0x0,(rtree_t *)&stack0xfffffffffffffe68,(rtree_ctx_t *)ptr
                                ,key);
    LOCK();
    plVar1 = (long *)((long)pvVar2 + 0x48);
    *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[rVar3.szind];
    UNLOCK();
  }
  arena_dalloc_no_tcache((tsdn_t *)0x0,ptr);
  return;
}

Assistant:

static void
a0idalloc(void *ptr, bool is_internal) {
	idalloctm(TSDN_NULL, ptr, NULL, NULL, is_internal, true);
}